

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TParseContext::vkRelaxedRemapFunctionCall
          (TParseContext *this,TSourceLoc *loc,TFunction *function,TIntermNode *arguments)

{
  TIntermediate *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TParameter *pTVar3;
  TIntermConstantUnion *pTVar4;
  TIntermAggregate *pTVar5;
  TIntermTyped *left;
  TIntermTyped *pTVar6;
  uint uVar7;
  TParameter tmpP;
  TString name;
  TType uintType;
  TFunction realFunc;
  TParameter local_288;
  TString local_270;
  TParameter local_248;
  TType local_228;
  TFunction local_190;
  
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x1b])(function);
  if (iVar2 == 0) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      CONCAT44(extraout_var,iVar2),"atomicCounterIncrement");
    if (iVar2 == 0) {
      local_270._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_270,"atomicAdd","");
      uVar7 = 0;
      TType::TType(&local_228,EbtUint,EvqTemporary,1,0,0,false);
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TFunction::TFunction(&local_190,&local_270,(TType *)CONCAT44(extraout_var_04,iVar2),EOpNull);
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (0 < iVar2) {
        do {
          local_288.name = (TString *)0x0;
          local_288.type = (TType *)0x0;
          local_288.defaultValue = (TIntermTyped *)0x0;
          iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar7);
          pTVar3 = TParameter::copyParam(&local_288,(TParameter *)CONCAT44(extraout_var_05,iVar2));
          TFunction::addParameter(&local_190,pTVar3);
          uVar7 = uVar7 + 1;
          iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
        } while ((int)uVar7 < iVar2);
      }
      local_288.name = (TString *)0x0;
      local_288.type = &local_228;
      local_288.defaultValue = (TIntermTyped *)0x0;
      local_248.defaultValue = (TIntermTyped *)0x0;
      local_248.name = (TString *)0x0;
      local_248.type = (TType *)0x0;
      pTVar3 = TParameter::copyParam(&local_248,&local_288);
      TFunction::addParameter(&local_190,pTVar3);
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar4 = TIntermediate::addConstantUnion(pTVar1,1,loc,true);
      pTVar5 = TIntermediate::growAggregate(pTVar1,arguments,(TIntermNode *)pTVar4);
      pTVar6 = handleFunctionCall(this,loc,&local_190,(TIntermNode *)pTVar5);
    }
    else {
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
      iVar2 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          *)CONCAT44(extraout_var_00,iVar2),"atomicCounterDecrement");
      if (iVar2 != 0) {
        iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[3])(function);
        iVar2 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)CONCAT44(extraout_var_01,iVar2),"atomicCounter");
        if (arguments == (TIntermNode *)0x0) {
          return (TIntermTyped *)0x0;
        }
        if (iVar2 != 0) {
          return (TIntermTyped *)0x0;
        }
        iVar2 = (*arguments->_vptr_TIntermNode[3])(arguments);
        if (CONCAT44(extraout_var_02,iVar2) != 0) {
          iVar2 = (*arguments->_vptr_TIntermNode[3])(arguments);
          return (TIntermTyped *)CONCAT44(extraout_var_03,iVar2);
        }
        goto LAB_0041be77;
      }
      local_270._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &local_270,"atomicAdd","");
      uVar7 = 0;
      TType::TType(&local_228,EbtUint,EvqTemporary,1,0,0,false);
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TFunction::TFunction(&local_190,&local_270,(TType *)CONCAT44(extraout_var_06,iVar2),EOpNull);
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (0 < iVar2) {
        do {
          local_288.name = (TString *)0x0;
          local_288.type = (TType *)0x0;
          local_288.defaultValue = (TIntermTyped *)0x0;
          iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar7);
          pTVar3 = TParameter::copyParam(&local_288,(TParameter *)CONCAT44(extraout_var_07,iVar2));
          TFunction::addParameter(&local_190,pTVar3);
          uVar7 = uVar7 + 1;
          iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
        } while ((int)uVar7 < iVar2);
      }
      pTVar6 = (TIntermTyped *)0x0;
      local_288.name = (TString *)0x0;
      local_288.type = &local_228;
      local_288.defaultValue = (TIntermTyped *)0x0;
      local_248.defaultValue = (TIntermTyped *)0x0;
      local_248.name = (TString *)0x0;
      local_248.type = (TType *)0x0;
      pTVar3 = TParameter::copyParam(&local_248,&local_288);
      TFunction::addParameter(&local_190,pTVar3);
      pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar4 = TIntermediate::addConstantUnion(pTVar1,-1,loc,true);
      pTVar5 = TIntermediate::growAggregate(pTVar1,arguments,(TIntermNode *)pTVar4);
      left = handleFunctionCall(this,loc,&local_190,(TIntermNode *)pTVar5);
      if (left != (TIntermTyped *)0x0) {
        pTVar4 = TIntermediate::addConstantUnion
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,1,loc,
                            true);
        pTVar6 = handleBinaryMath(this,loc,"-",EOpSub,left,&pTVar4->super_TIntermTyped);
      }
    }
    TFunction::~TFunction(&local_190);
  }
  else {
LAB_0041be77:
    pTVar6 = (TIntermTyped *)0x0;
  }
  return pTVar6;
}

Assistant:

TIntermTyped* TParseContext::vkRelaxedRemapFunctionCall(const TSourceLoc& loc, TFunction* function, TIntermNode* arguments)
{
    TIntermTyped* result = nullptr;

    if (function->getBuiltInOp() != EOpNull) {
        return nullptr;
    }

    if (function->getName() == "atomicCounterIncrement") {
        // change atomicCounterIncrement into an atomicAdd of 1
        TString name("atomicAdd");
        TType uintType(EbtUint);

        TFunction realFunc(&name, function->getType());

        // Use copyParam to avoid shared ownership of the 'type' field
        // of the parameter.
        for (int i = 0; i < function->getParamCount(); ++i) {
            realFunc.addParameter(TParameter().copyParam((*function)[i]));
        }

        TParameter tmpP = { nullptr, &uintType, {} };
        realFunc.addParameter(TParameter().copyParam(tmpP));
        arguments = intermediate.growAggregate(arguments, intermediate.addConstantUnion(1, loc, true));

        result = handleFunctionCall(loc, &realFunc, arguments);
    } else if (function->getName() == "atomicCounterDecrement") {
        // change atomicCounterDecrement into an atomicAdd with -1
        // and subtract 1 from result, to return post-decrement value
        TString name("atomicAdd");
        TType uintType(EbtUint);

        TFunction realFunc(&name, function->getType());

        for (int i = 0; i < function->getParamCount(); ++i) {
            realFunc.addParameter(TParameter().copyParam((*function)[i]));
        }

        TParameter tmpP = { nullptr, &uintType, {} };
        realFunc.addParameter(TParameter().copyParam(tmpP));
        arguments = intermediate.growAggregate(arguments, intermediate.addConstantUnion(-1, loc, true));

        result = handleFunctionCall(loc, &realFunc, arguments);

        // post decrement, so that it matches AtomicCounterDecrement semantics
        if (result) {
            result = handleBinaryMath(loc, "-", EOpSub, result, intermediate.addConstantUnion(1, loc, true));
        }
    } else if (function->getName() == "atomicCounter") {
        // change atomicCounter into a direct read of the variable
        if (arguments && arguments->getAsTyped()) {
            result = arguments->getAsTyped();
        }
    }

    return result;
}